

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::addTarget
          (ValueFederateManager *this,Publication *pub,string_view target)

{
  handle local_48;
  string_view target_local;
  
  target_local._M_str = target._M_str;
  target_local._M_len = target._M_len;
  (*this->coreObject->_vptr_Core[0x3d])
            (this->coreObject,(ulong)(uint)(pub->super_Interface).handle.hid,target_local._M_len,
             target_local._M_str,0x75);
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::lock(&local_48,&this->targetIDs);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
  ::
  _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
              *)local_48.data,&target_local,&(pub->super_Interface).handle);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  return;
}

Assistant:

void ValueFederateManager::addTarget(const Publication& pub, std::string_view target)
{
    coreObject->addDestinationTarget(pub.handle, target);
    targetIDs.lock()->emplace(target, pub.handle);
}